

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsg_model.c
# Opt level: O1

void fsg_model_write_fsm(fsg_model_t *fsg,FILE *fp)

{
  int i;
  
  fsg_model_write_fsm_trans(fsg,fsg->start_state,fp);
  if (0 < fsg->n_state) {
    i = 0;
    do {
      if (i != fsg->start_state) {
        fsg_model_write_fsm_trans(fsg,i,fp);
      }
      i = i + 1;
    } while (i < fsg->n_state);
  }
  fprintf((FILE *)fp,"%d 0\n",(ulong)(uint)fsg->final_state);
  fflush((FILE *)fp);
  return;
}

Assistant:

void
fsg_model_write_fsm(fsg_model_t * fsg, FILE * fp)
{
    int i;

    /* Write transitions from initial state first. */
    fsg_model_write_fsm_trans(fsg, fsg_model_start_state(fsg), fp);

    /* Other states. */
    for (i = 0; i < fsg->n_state; i++) {
        if (i == fsg_model_start_state(fsg))
            continue;
        fsg_model_write_fsm_trans(fsg, i, fp);
    }

    /* Final state. */
    fprintf(fp, "%d 0\n", fsg_model_final_state(fsg));

    fflush(fp);
}